

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O2

void __thiscall despot::LaserTag::LaserTag(LaserTag *this)

{
  string local_1b0;
  istringstream iss;
  
  BaseTag::BaseTag(&this->super_BaseTag);
  *(undefined ***)&this->super_BaseTag = &PTR__LaserTag_00121a08;
  *(undefined ***)&(this->super_BaseTag).super_BeliefMDP = &PTR__LaserTag_00121b38;
  *(undefined ***)&(this->super_BaseTag).super_StateIndexer = &PTR__LaserTag_00121c40;
  *(undefined ***)&(this->super_BaseTag).super_StatePolicy = &PTR__LaserTag_00121c78;
  *(undefined ***)&(this->super_BaseTag).super_MMAPInferencer = &PTR__LaserTag_00121ca0;
  this->noise_sigma_ = 2.5;
  this->unit_size_ = 1.0;
  (this->reading_distributions_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reading_distributions_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reading_distributions_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BaseTag::RandomMap_abi_cxx11_(&local_1b0,&this->super_BaseTag,7,0xb,8);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&local_1b0,_S_in);
  std::__cxx11::string::~string((string *)&local_1b0);
  BaseTag::Init(&this->super_BaseTag,(istream *)&iss);
  Init(this);
  (this->super_BaseTag).robot_pos_unknown_ = false;
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return;
}

Assistant:

LaserTag::LaserTag() :
	BaseTag(),
	noise_sigma_(2.5),
	unit_size_(1.0) {
	istringstream iss(RandomMap(7, 11, 8));
	BaseTag::Init(iss);
	Init();
  robot_pos_unknown_ = false;
}